

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_precision.cpp
# Opt level: O3

void anon_unknown.dwarf_65320::find_lowerable_rvalues_visitor::stack_enter
               (ir_instruction *ir,void *data)

{
  byte bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  void *unaff_R12;
  undefined8 *puVar10;
  ulong uVar11;
  stack_entry entry;
  vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> local_48;
  
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = *(byte *)((long)data + 0x30);
  puVar2 = *(undefined8 **)((long)data + 0x40);
  if (puVar2 == *(undefined8 **)((long)data + 0x48)) {
    puVar3 = *(undefined8 **)((long)data + 0x38);
    if ((long)puVar2 - (long)puVar3 == 0x7ffffffffffffff8) {
      uVar8 = std::__throw_length_error("vector::_M_realloc_insert");
      __cxa_begin_catch(uVar8);
      operator_delete(unaff_R12);
      uVar8 = __cxa_rethrow();
      __cxa_end_catch();
      if (local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar8);
    }
    lVar4 = (long)puVar2 - (long)puVar3 >> 3;
    uVar11 = lVar4 * -0x3333333333333333;
    uVar5 = 1;
    if (puVar2 != puVar3) {
      uVar5 = uVar11;
    }
    uVar9 = uVar5 + uVar11;
    if (0x333333333333332 < uVar9) {
      uVar9 = 0x333333333333333;
    }
    if (CARRY8(uVar5,uVar11)) {
      uVar9 = 0x333333333333333;
    }
    if (uVar9 == 0) {
      puVar6 = (undefined8 *)0x0;
    }
    else {
      puVar6 = (undefined8 *)operator_new(uVar9 * 0x28);
    }
    puVar7 = puVar6 + lVar4;
    *(uint *)(puVar7 + 1) = (uint)bVar1;
    *puVar7 = ir;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector
              ((vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> *)(puVar7 + 2),&local_48
              );
    puVar10 = puVar6;
    for (puVar7 = puVar3; puVar2 != puVar7; puVar7 = puVar7 + 5) {
      *(undefined4 *)(puVar10 + 1) = *(undefined4 *)(puVar7 + 1);
      *puVar10 = *puVar7;
      uVar8 = puVar7[3];
      puVar10[2] = puVar7[2];
      puVar10[3] = uVar8;
      puVar10[4] = puVar7[4];
      puVar7[2] = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar10 = puVar10 + 5;
    }
    if (puVar3 != (undefined8 *)0x0) {
      operator_delete(puVar3);
    }
    *(undefined8 **)((long)data + 0x38) = puVar6;
    *(undefined8 **)((long)data + 0x40) = puVar10 + 5;
    *(undefined8 **)((long)data + 0x48) = puVar6 + uVar9 * 5;
  }
  else {
    *(uint *)(puVar2 + 1) = (uint)bVar1;
    *puVar2 = ir;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector
              ((vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> *)(puVar2 + 2),&local_48
              );
    *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + 0x28;
  }
  if (local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
find_lowerable_rvalues_visitor::stack_enter(class ir_instruction *ir,
                                            void *data)
{
   find_lowerable_rvalues_visitor *state =
      (find_lowerable_rvalues_visitor *) data;

   /* Add a new stack entry for this instruction */
   stack_entry entry;

   entry.instr = ir;
   entry.state = state->in_assignee ? CANT_LOWER : UNKNOWN;

   state->stack.push_back(entry);
}